

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void load_variable(ch_compilation *comp,ch_lexeme name)

{
  _Bool _Var1;
  uint8_t local_40 [4];
  ch_dataptr local_3c;
  uint8_t le_value_1 [4];
  ch_dataptr string_ptr;
  ch_op op_2;
  uint8_t local_2c [3];
  ch_argcount _argcount;
  ch_op op_1;
  uint8_t le_value [4];
  ch_op op;
  uint8_t offset;
  ch_compilation *comp_local;
  ch_lexeme name_local;
  
  _Var1 = scope_lookup(comp->scope,name,le_value + 3);
  if (_Var1) {
    op_1 = OP_LOAD_LOCAL;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op_1,1);
    ch_uint32_to_le_array((uint)le_value[3],local_2c);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_2c,4);
  }
  else {
    _Var1 = upvalue_lookup(comp,comp->scope,name,le_value + 3);
    if (_Var1) {
      op_2 = OP_LOAD_UPVALUE;
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op_2,1);
      string_ptr._3_1_ = le_value[3];
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,(void *)((long)&string_ptr + 3),1);
    }
    else {
      le_value_1[0] = '\x18';
      le_value_1[1] = '\0';
      le_value_1[2] = '\0';
      le_value_1[3] = '\0';
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,le_value_1,1);
      local_3c = emit_string(comp,name.start,name.size);
      ch_uint32_to_le_array(local_3c,local_40);
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_40,4);
    }
  }
  return;
}

Assistant:

void load_variable(ch_compilation *comp, ch_lexeme name) {
  uint8_t offset;

  if (scope_lookup(comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_LOCAL);
    EMIT_PTR(GET_EMIT(comp), offset);
  } else if(upvalue_lookup(comp, comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_UPVALUE);
    EMIT_ARGCOUNT(GET_EMIT(comp), offset);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_GLOBAL);
    ch_dataptr string_ptr = emit_string(comp, name.start, name.size);
    EMIT_PTR(GET_EMIT(comp), string_ptr);
  }
}